

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostcheck.c
# Opt level: O0

int Curl_cert_hostcheck(char *match_pattern,char *hostname)

{
  int iVar1;
  char *pattern;
  char *hostname_00;
  char *hostp;
  char *matchp;
  int res;
  char *hostname_local;
  char *match_pattern_local;
  
  matchp._4_4_ = 0;
  if ((((match_pattern != (char *)0x0) && (*match_pattern != '\0')) && (hostname != (char *)0x0)) &&
     ((*hostname != '\0' && (pattern = (*Curl_cstrdup)(match_pattern), pattern != (char *)0x0)))) {
    hostname_00 = (*Curl_cstrdup)(hostname);
    if (hostname_00 != (char *)0x0) {
      iVar1 = hostmatch(hostname_00,pattern);
      matchp._4_4_ = (uint)(iVar1 == 1);
      (*Curl_cfree)(hostname_00);
    }
    (*Curl_cfree)(pattern);
  }
  return matchp._4_4_;
}

Assistant:

int Curl_cert_hostcheck(const char *match_pattern, const char *hostname)
{
  int res = 0;
  if(!match_pattern || !*match_pattern ||
      !hostname || !*hostname) /* sanity check */
    ;
  else {
    char *matchp = strdup(match_pattern);
    if(matchp) {
      char *hostp = strdup(hostname);
      if(hostp) {
        if(hostmatch(hostp, matchp) == CURL_HOST_MATCH)
          res = 1;
        free(hostp);
      }
      free(matchp);
    }
  }

  return res;
}